

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConfigInstanceIdentifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigInstanceIdentifierSyntax,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  ConfigInstanceIdentifierSyntax *pCVar11;
  
  pCVar11 = (ConfigInstanceIdentifierSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConfigInstanceIdentifierSyntax *)this->endPtr < pCVar11 + 1) {
    pCVar11 = (ConfigInstanceIdentifierSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pCVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pCVar11->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pCVar11->super_SyntaxNode).kind = ConfigInstanceIdentifier;
  (pCVar11->dot).kind = TVar3;
  (pCVar11->dot).field_0x2 = uVar4;
  (pCVar11->dot).numFlags = (NumericTokenFlags)NVar5.raw;
  (pCVar11->dot).rawLen = uVar6;
  (pCVar11->dot).info = pIVar1;
  (pCVar11->name).kind = TVar7;
  (pCVar11->name).field_0x2 = uVar8;
  (pCVar11->name).numFlags = (NumericTokenFlags)NVar9.raw;
  (pCVar11->name).rawLen = uVar10;
  (pCVar11->name).info = pIVar2;
  return pCVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }